

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

HighsInt __thiscall HighsCliqueTable::getNumImplications(HighsCliqueTable *this,HighsInt col)

{
  int iVar1;
  char *pcVar2;
  reference pvVar3;
  int __c;
  int __c_00;
  uint in_ESI;
  long in_RDI;
  anon_class_16_2_ec33deae countImplics;
  HighsInt numimplics;
  HighsInt i1;
  HighsInt i0;
  anon_class_16_2_ec33deae *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  value_type vVar4;
  CliqueVar local_1c;
  int local_18;
  CliqueVar local_14;
  int local_10;
  uint local_c;
  
  pcVar2 = (char *)(ulong)in_ESI;
  local_c = in_ESI;
  CliqueVar::CliqueVar(&local_14,in_ESI,0);
  pcVar2 = CliqueVar::index(&local_14,pcVar2,__c);
  local_10 = (int)pcVar2;
  pcVar2 = (char *)(ulong)local_c;
  CliqueVar::CliqueVar(&local_1c,local_c,1);
  pcVar2 = CliqueVar::index(&local_1c,pcVar2,__c_00);
  local_18 = (int)pcVar2;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd0),(long)local_10);
  vVar4 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd0),(long)local_18);
  iVar1 = vVar4 + *pvVar3;
  std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::operator[]
            ((vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_> *)
             (in_RDI + 0x18),(long)local_10);
  HighsHashTree<int,int>::for_each<HighsCliqueTable::getNumImplications(int)::__0&>
            ((HighsHashTree<int,_int> *)CONCAT44(vVar4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::operator[]
            ((vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_> *)
             (in_RDI + 0x18),(long)local_18);
  HighsHashTree<int,int>::for_each<HighsCliqueTable::getNumImplications(int)::__0&>
            ((HighsHashTree<int,_int> *)CONCAT44(vVar4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  return iVar1;
}

Assistant:

HighsInt HighsCliqueTable::getNumImplications(HighsInt col) {
  // first count all cliques as one implication, so that cliques of size two
  // are accounted for already
  HighsInt i0 = CliqueVar(col, 0).index();
  HighsInt i1 = CliqueVar(col, 1).index();
  HighsInt numimplics = numcliquesvar[i0] + numcliquesvar[i1];

  // now loop over cliques larger than size two and add the cliquelength - 1 as
  // additional implications
  auto countImplics = [&](HighsInt cliqueid) {
    HighsInt nimplics = cliques[cliqueid].end - cliques[cliqueid].start - 1;
    nimplics *= (1 + cliques[cliqueid].equality);
    numimplics += nimplics - 1;
  };
  invertedHashList[i0].for_each(countImplics);
  invertedHashList[i1].for_each(countImplics);
  return numimplics;
}